

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_expr_sizeof(CPState *cp,CPValue *k,int wantsz)

{
  int iVar1;
  CTypeID CVar2;
  CTInfo CVar3;
  CTSize sz;
  
  iVar1 = cp_opt(cp,0x28);
  if (iVar1 == 0) {
    cp_expr_unary(cp,k);
  }
  else {
    iVar1 = cp_istypedecl(cp);
    if (iVar1 == 0) {
      cp_expr_comma(cp,k);
    }
    else {
      CVar2 = cp_decl_abstract(cp);
      k->id = CVar2;
    }
    cp_check(cp,0x29);
  }
  CVar3 = lj_ctype_info(cp->cts,k->id,&sz);
  if (wantsz == 0) {
    sz = 1 << ((byte)(CVar3 >> 0x10) & 0xf);
  }
  else if (sz == 0xffffffff) {
    if (k->id != 0x15) {
      cp_err(cp,LJ_ERR_FFI_INVSIZE);
    }
    goto LAB_0014c428;
  }
  (k->field_0).u32 = sz;
LAB_0014c428:
  k->id = 10;
  return;
}

Assistant:

static void cp_expr_sizeof(CPState *cp, CPValue *k, int wantsz)
{
  CTSize sz;
  CTInfo info;
  if (cp_opt(cp, '(')) {
    if (cp_istypedecl(cp))
      k->id = cp_decl_abstract(cp);
    else
      cp_expr_comma(cp, k);
    cp_check(cp, ')');
  } else {
    cp_expr_unary(cp, k);
  }
  info = lj_ctype_info(cp->cts, k->id, &sz);
  if (wantsz) {
    if (sz != CTSIZE_INVALID)
      k->u32 = sz;
    else if (k->id != CTID_A_CCHAR)  /* Special case for sizeof("string"). */
      cp_err(cp, LJ_ERR_FFI_INVSIZE);
  } else {
    k->u32 = 1u << ctype_align(info);
  }
  k->id = CTID_UINT32;  /* Really size_t. */
}